

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ConvertExpr *expr)

{
  Enum EVar1;
  ConvertExpr *expr_local;
  CWriter *this_local;
  
  EVar1 = Opcode::operator_cast_to_Enum(&expr->opcode);
  switch(EVar1) {
  case I32Eqz:
  case I64Eqz:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"!");
    break;
  default:
    abort();
  case I32WrapI64:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(u32)");
    break;
  case I32TruncF32S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I32_TRUNC_S_F32");
    break;
  case I32TruncF32U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I32_TRUNC_U_F32");
    break;
  case I32TruncF64S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I32_TRUNC_S_F64");
    break;
  case I32TruncF64U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I32_TRUNC_U_F64");
    break;
  case I64ExtendI32S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(u64)(s64)(s32)");
    break;
  case I64ExtendI32U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(u64)");
    break;
  case I64TruncF32S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I64_TRUNC_S_F32");
    break;
  case I64TruncF32U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I64_TRUNC_U_F32");
    break;
  case I64TruncF64S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I64_TRUNC_S_F64");
    break;
  case I64TruncF64U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I64_TRUNC_U_F64");
    break;
  case F32ConvertI32S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(f32)(s32)");
    break;
  case F32ConvertI32U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(f32)");
    break;
  case F32ConvertI64S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(f32)(s64)");
    break;
  case F32ConvertI64U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(f32)");
    break;
  case F32DemoteF64:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(f32)wasm_quiet");
    break;
  case F64ConvertI32S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(f64)(s32)");
    break;
  case F64ConvertI32U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(f64)");
    break;
  case F64ConvertI64S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(f64)(s64)");
    break;
  case F64ConvertI64U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(f64)");
    break;
  case F64PromoteF32:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"(f64)wasm_quietf");
    break;
  case I32ReinterpretF32:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"i32_reinterpret_f32");
    break;
  case I64ReinterpretF64:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"i64_reinterpret_f64");
    break;
  case F32ReinterpretI32:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"f32_reinterpret_i32");
    break;
  case F64ReinterpretI64:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"f64_reinterpret_i64");
    break;
  case I32TruncSatF32S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I32_TRUNC_SAT_S_F32");
    break;
  case I32TruncSatF32U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I32_TRUNC_SAT_U_F32");
    break;
  case I32TruncSatF64S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I32_TRUNC_SAT_S_F64");
    break;
  case I32TruncSatF64U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I32_TRUNC_SAT_U_F64");
    break;
  case I64TruncSatF32S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I64_TRUNC_SAT_S_F32");
    break;
  case I64TruncSatF32U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I64_TRUNC_SAT_U_F32");
    break;
  case I64TruncSatF64S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I64_TRUNC_SAT_S_F64");
    break;
  case I64TruncSatF64U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"I64_TRUNC_SAT_U_F64");
    break;
  case F32X4DemoteF64X2Zero:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"v128_f32x4_demote_f64x2_zero");
    break;
  case F64X2PromoteLowF32X4:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"v128_f64x2_promote_low_f32x4");
    break;
  case I32X4TruncSatF32X4S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i32x4_trunc_sat_f32x4");
    break;
  case I32X4TruncSatF32X4U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u32x4_trunc_sat_f32x4");
    break;
  case F32X4ConvertI32X4S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f32x4_convert_i32x4");
    break;
  case F32X4ConvertI32X4U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f32x4_convert_u32x4");
    break;
  case I32X4TruncSatF64X2SZero:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"v128_i32x4_trunc_sat_f64x2_zero");
    break;
  case I32X4TruncSatF64X2UZero:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"v128_u32x4_trunc_sat_f64x2_zero");
    break;
  case F64X2ConvertLowI32X4S:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"v128_f64x2_convert_low_i32x4");
    break;
  case F64X2ConvertLowI32X4U:
    WriteSimpleUnaryExpr(this,(Opcode)(expr->opcode).enum_,"v128_f64x2_convert_low_u32x4");
  }
  return;
}

Assistant:

void CWriter::Write(const ConvertExpr& expr) {
  switch (expr.opcode) {
    case Opcode::I32Eqz:
    case Opcode::I64Eqz:
      WriteSimpleUnaryExpr(expr.opcode, "!");
      break;

    case Opcode::I64ExtendI32S:
      WriteSimpleUnaryExpr(expr.opcode, "(u64)(s64)(s32)");
      break;

    case Opcode::I64ExtendI32U:
      WriteSimpleUnaryExpr(expr.opcode, "(u64)");
      break;

    case Opcode::I32WrapI64:
      WriteSimpleUnaryExpr(expr.opcode, "(u32)");
      break;

    case Opcode::I32TruncF32S:
      WriteSimpleUnaryExpr(expr.opcode, "I32_TRUNC_S_F32");
      break;

    case Opcode::I64TruncF32S:
      WriteSimpleUnaryExpr(expr.opcode, "I64_TRUNC_S_F32");
      break;

    case Opcode::I32TruncF64S:
      WriteSimpleUnaryExpr(expr.opcode, "I32_TRUNC_S_F64");
      break;

    case Opcode::I64TruncF64S:
      WriteSimpleUnaryExpr(expr.opcode, "I64_TRUNC_S_F64");
      break;

    case Opcode::I32TruncF32U:
      WriteSimpleUnaryExpr(expr.opcode, "I32_TRUNC_U_F32");
      break;

    case Opcode::I64TruncF32U:
      WriteSimpleUnaryExpr(expr.opcode, "I64_TRUNC_U_F32");
      break;

    case Opcode::I32TruncF64U:
      WriteSimpleUnaryExpr(expr.opcode, "I32_TRUNC_U_F64");
      break;

    case Opcode::I64TruncF64U:
      WriteSimpleUnaryExpr(expr.opcode, "I64_TRUNC_U_F64");
      break;

    case Opcode::I32TruncSatF32S:
      WriteSimpleUnaryExpr(expr.opcode, "I32_TRUNC_SAT_S_F32");
      break;

    case Opcode::I64TruncSatF32S:
      WriteSimpleUnaryExpr(expr.opcode, "I64_TRUNC_SAT_S_F32");
      break;

    case Opcode::I32TruncSatF64S:
      WriteSimpleUnaryExpr(expr.opcode, "I32_TRUNC_SAT_S_F64");
      break;

    case Opcode::I64TruncSatF64S:
      WriteSimpleUnaryExpr(expr.opcode, "I64_TRUNC_SAT_S_F64");
      break;

    case Opcode::I32TruncSatF32U:
      WriteSimpleUnaryExpr(expr.opcode, "I32_TRUNC_SAT_U_F32");
      break;

    case Opcode::I64TruncSatF32U:
      WriteSimpleUnaryExpr(expr.opcode, "I64_TRUNC_SAT_U_F32");
      break;

    case Opcode::I32TruncSatF64U:
      WriteSimpleUnaryExpr(expr.opcode, "I32_TRUNC_SAT_U_F64");
      break;

    case Opcode::I64TruncSatF64U:
      WriteSimpleUnaryExpr(expr.opcode, "I64_TRUNC_SAT_U_F64");
      break;

    case Opcode::F32ConvertI32S:
      WriteSimpleUnaryExpr(expr.opcode, "(f32)(s32)");
      break;

    case Opcode::F32ConvertI64S:
      WriteSimpleUnaryExpr(expr.opcode, "(f32)(s64)");
      break;

    case Opcode::F32ConvertI32U:
      WriteSimpleUnaryExpr(expr.opcode, "(f32)");
      break;

    case Opcode::F32DemoteF64:
      WriteSimpleUnaryExpr(expr.opcode, "(f32)wasm_quiet");
      break;

    case Opcode::F32ConvertI64U:
      // TODO(binji): This needs to be handled specially (see
      // wabt_convert_uint64_to_float).
      WriteSimpleUnaryExpr(expr.opcode, "(f32)");
      break;

    case Opcode::F64ConvertI32S:
      WriteSimpleUnaryExpr(expr.opcode, "(f64)(s32)");
      break;

    case Opcode::F64ConvertI64S:
      WriteSimpleUnaryExpr(expr.opcode, "(f64)(s64)");
      break;

    case Opcode::F64ConvertI32U:
      WriteSimpleUnaryExpr(expr.opcode, "(f64)");
      break;

    case Opcode::F64PromoteF32:
      WriteSimpleUnaryExpr(expr.opcode, "(f64)wasm_quietf");
      break;

    case Opcode::F64ConvertI64U:
      // TODO(binji): This needs to be handled specially (see
      // wabt_convert_uint64_to_double).
      WriteSimpleUnaryExpr(expr.opcode, "(f64)");
      break;

    case Opcode::F32ReinterpretI32:
      WriteSimpleUnaryExpr(expr.opcode, "f32_reinterpret_i32");
      break;

    case Opcode::I32ReinterpretF32:
      WriteSimpleUnaryExpr(expr.opcode, "i32_reinterpret_f32");
      break;

    case Opcode::F64ReinterpretI64:
      WriteSimpleUnaryExpr(expr.opcode, "f64_reinterpret_i64");
      break;

    case Opcode::I64ReinterpretF64:
      WriteSimpleUnaryExpr(expr.opcode, "i64_reinterpret_f64");
      break;

    case Opcode::I32X4TruncSatF32X4S:
      WriteSimpleUnaryExpr(expr.opcode, "simde_wasm_i32x4_trunc_sat_f32x4");
      break;

    case Opcode::I32X4TruncSatF32X4U:
      WriteSimpleUnaryExpr(expr.opcode, "simde_wasm_u32x4_trunc_sat_f32x4");
      break;

    case Opcode::I32X4TruncSatF64X2SZero:
      WriteSimpleUnaryExpr(expr.opcode, "v128_i32x4_trunc_sat_f64x2_zero");
      break;

    case Opcode::I32X4TruncSatF64X2UZero:
      WriteSimpleUnaryExpr(expr.opcode, "v128_u32x4_trunc_sat_f64x2_zero");
      break;

    case Opcode::F32X4ConvertI32X4S:
      WriteSimpleUnaryExpr(expr.opcode, "simde_wasm_f32x4_convert_i32x4");
      break;

    case Opcode::F32X4ConvertI32X4U:
      WriteSimpleUnaryExpr(expr.opcode, "simde_wasm_f32x4_convert_u32x4");
      break;

    case Opcode::F32X4DemoteF64X2Zero:
      WriteSimpleUnaryExpr(expr.opcode, "v128_f32x4_demote_f64x2_zero");
      break;

    case Opcode::F64X2ConvertLowI32X4S:
      WriteSimpleUnaryExpr(expr.opcode, "v128_f64x2_convert_low_i32x4");
      break;

    case Opcode::F64X2ConvertLowI32X4U:
      WriteSimpleUnaryExpr(expr.opcode, "v128_f64x2_convert_low_u32x4");
      break;

    case Opcode::F64X2PromoteLowF32X4:
      WriteSimpleUnaryExpr(expr.opcode, "v128_f64x2_promote_low_f32x4");
      break;

    default:
      WABT_UNREACHABLE;
  }
}